

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObservation.cpp
# Opt level: O0

bool __thiscall CEObservation::NeedsUpdate(CEObservation *this)

{
  long in_RDI;
  double dVar1;
  undefined1 local_1;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_1 = false;
  }
  else {
    dVar1 = CEDate::operator_cast_to_double((CEDate *)0x15c4ed);
    if ((dVar1 != *(double *)(in_RDI + 0x20)) || (NAN(dVar1) || NAN(*(double *)(in_RDI + 0x20)))) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool CEObservation::NeedsUpdate(void)
{
    // Make sure the date object isnt nullptr
    if (date_ == nullptr) {
        return false ;
    }
    // Check if the date object has changed since the last time we querried it
    else if ((*date_) != cached_date_) {
        return true ;
    }
    // Otherwise we want to return false
    else {
        return false ;
    }
}